

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_c8;
  TagAlias local_78;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_c8.first._M_dataplus._M_p = (pointer)&local_c8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"[@","");
  uVar2 = alias->_M_string_length;
  if (uVar2 < local_c8.first._M_string_length) {
LAB_00127843:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
      operator_delete(local_c8.first._M_dataplus._M_p);
    }
  }
  else {
    if (local_c8.first._M_string_length != 0) {
      iVar4 = bcmp(local_c8.first._M_dataplus._M_p,(alias->_M_dataplus)._M_p,
                   local_c8.first._M_string_length);
      if (iVar4 != 0) goto LAB_00127843;
    }
    if (uVar2 == 0) {
      bVar5 = true;
    }
    else {
      bVar5 = (alias->_M_dataplus)._M_p[uVar2 - 1] != ']';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
      operator_delete(local_c8.first._M_dataplus._M_p);
    }
    if (!bVar5) {
      local_48 = *(undefined4 *)&lineInfo->file;
      uStack_44 = *(undefined4 *)((long)&lineInfo->file + 4);
      uStack_40 = (undefined4)lineInfo->line;
      uStack_3c = *(undefined4 *)((long)&lineInfo->line + 4);
      paVar1 = &local_78.tag.field_2;
      pcVar3 = (tag->_M_dataplus)._M_p;
      local_78.tag._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + tag->_M_string_length);
      local_78.lineInfo.file = (char *)CONCAT44(uStack_44,local_48);
      local_78.lineInfo.line = CONCAT44(uStack_3c,uStack_40);
      clara::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>(&local_c8,alias,&local_78);
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.second.tag._M_dataplus._M_p != &local_c8.second.tag.field_2) {
        operator_delete(local_c8.second.tag._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
        operator_delete(local_c8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.tag._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.tag._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,"error: tag alias, \'",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,(alias->_M_dataplus)._M_p,
                 alias->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,"\' already registered.\n",
                 0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,"\tFirst seen at: ",0x10);
      iVar4 = (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(this,alias);
      operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,
                 (SourceLineInfo *)(CONCAT44(extraout_var,iVar4) + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_78.tag.field_2._M_allocated_capacity,"\tRedefined at: ",0xf);
      operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,lineInfo);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_c8.first);
    }
  }
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_78.tag.field_2._M_allocated_capacity,"error: tag alias, \'",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_78.tag.field_2._M_allocated_capacity,(alias->_M_dataplus)._M_p,
             alias->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_78.tag.field_2._M_allocated_capacity,
             "\' is not of the form [@alias name].\n",0x24);
  operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,lineInfo);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_c8.first);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }